

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_render_pass
               (VkRenderPassCreateInfo *create_info,Hash *out_hash)

{
  VkAttachmentDescription *pVVar1;
  VkSubpassDependency *pVVar2;
  VkSubpassDescription *pVVar3;
  VkAttachmentReference *pVVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint32_t i;
  ulong uVar10;
  uint32_t i_3;
  uint32_t i_1;
  Hasher local_30;
  
  uVar6 = ((ulong)create_info->flags ^ 0xaf63bd4c8601b7df) * 0x100000001b3;
  if ((ulong)create_info->flags == 0) {
    uVar6 = 0xaf63bd4c8601b7df;
  }
  local_30.h = ((uVar6 ^ create_info->attachmentCount) * 0x100000001b3 ^
               (ulong)create_info->dependencyCount) * 0x100000001b3 ^
               (ulong)create_info->subpassCount;
  pVVar1 = create_info->pAttachments;
  for (lVar8 = 0; (ulong)create_info->attachmentCount * 0x24 - lVar8 != 0; lVar8 = lVar8 + 0x24) {
    local_30.h = ((((((((local_30.h * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->flags + lVar8)
                        ) * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->initialLayout + lVar8))
                       * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->finalLayout + lVar8)) *
                      0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->format + lVar8)) *
                     0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->loadOp + lVar8)) *
                    0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->storeOp + lVar8)) *
                   0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->stencilLoadOp + lVar8)) *
                  0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->stencilStoreOp + lVar8)) *
                 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar1->samples + lVar8);
  }
  pVVar2 = create_info->pDependencies;
  for (lVar8 = 0; (ulong)create_info->dependencyCount * 0x1c - lVar8 != 0; lVar8 = lVar8 + 0x1c) {
    local_30.h = ((((((local_30.h * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&pVVar2->dependencyFlags + lVar8)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar2->dstAccessMask + lVar8)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)&pVVar2->srcAccessMask + lVar8)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar2->srcSubpass + lVar8)) * 0x100000001b3 ^
                  (ulong)*(uint *)((long)&pVVar2->dstSubpass + lVar8)) * 0x100000001b3 ^
                 (ulong)*(uint *)((long)&pVVar2->srcStageMask + lVar8)) * 0x100000001b3 ^
                 (ulong)*(uint *)((long)&pVVar2->dstStageMask + lVar8);
  }
  pVVar3 = create_info->pSubpasses;
  for (uVar6 = 0; uVar6 != create_info->subpassCount; uVar6 = uVar6 + 1) {
    uVar9 = (ulong)pVVar3[uVar6].colorAttachmentCount;
    uVar7 = ((((local_30.h * 0x100000001b3 ^ (ulong)pVVar3[uVar6].flags) * 0x100000001b3 ^ uVar9) *
              0x100000001b3 ^ (ulong)pVVar3[uVar6].inputAttachmentCount) * 0x100000001b3 ^
            (ulong)pVVar3[uVar6].preserveAttachmentCount) * 0x100000001b3 ^
            (ulong)pVVar3[uVar6].pipelineBindPoint;
    for (uVar10 = 0; pVVar3[uVar6].preserveAttachmentCount != uVar10; uVar10 = uVar10 + 1) {
      uVar7 = uVar7 * 0x100000001b3 ^ (ulong)pVVar3[uVar6].pPreserveAttachments[uVar10];
    }
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      uVar7 = (uVar7 * 0x100000001b3 ^ (ulong)pVVar3[uVar6].pColorAttachments[uVar10].attachment) *
              0x100000001b3 ^ (ulong)pVVar3[uVar6].pColorAttachments[uVar10].layout;
    }
    for (uVar10 = 0; pVVar3[uVar6].inputAttachmentCount != uVar10; uVar10 = uVar10 + 1) {
      uVar7 = (uVar7 * 0x100000001b3 ^ (ulong)pVVar3[uVar6].pInputAttachments[uVar10].attachment) *
              0x100000001b3 ^ (ulong)pVVar3[uVar6].pInputAttachments[uVar10].layout;
    }
    pVVar4 = pVVar3[uVar6].pResolveAttachments;
    if (pVVar4 != (VkAttachmentReference *)0x0) {
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar7 = (uVar7 * 0x100000001b3 ^ (ulong)pVVar4[uVar10].attachment) * 0x100000001b3 ^
                (ulong)pVVar4[uVar10].layout;
      }
    }
    pVVar4 = pVVar3[uVar6].pDepthStencilAttachment;
    if (pVVar4 == (VkAttachmentReference *)0x0) {
      local_30.h = uVar7 * 0x100000001b3;
    }
    else {
      local_30.h = (uVar7 * 0x100000001b3 ^ (ulong)pVVar4->attachment) * 0x100000001b3 ^
                   (ulong)pVVar4->layout;
    }
  }
  bVar5 = hash_pnext_chain((StateRecorder *)0x0,&local_30,create_info->pNext,(DynamicStateInfo *)0x0
                           ,0);
  if (bVar5) {
    *out_hash = local_30.h;
  }
  return bVar5;
}

Assistant:

bool compute_hash_render_pass(const VkRenderPassCreateInfo &create_info, Hash *out_hash)
{
	Hasher h;

	// Conditionally branch to remain hash compatible.
	if (create_info.flags != 0)
		h.u32(create_info.flags);

	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		hash_attachment(h, att);
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		hash_dependency(h, dep);
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		hash_subpass(h, subpass);
	}

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}